

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O2

void __thiscall
duckdb::UncompressedCompressState::CreateEmptySegment
          (UncompressedCompressState *this,idx_t row_start)

{
  CompressionFunction *function;
  PartialBlockManager *this_00;
  _func_int **pp_Var1;
  undefined1 __p [8];
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> _Var2;
  DatabaseInstance *db;
  LogicalType *type;
  idx_t segment_size;
  pointer pCVar3;
  CompressedSegmentState *pCVar4;
  ColumnCheckpointState *pCVar5;
  BlockManager *pBVar6;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
  compressed_segment;
  undefined1 local_38 [8];
  _Head_base<0UL,_duckdb::CompressedSegmentState_*,_false> local_30;
  
  db = ColumnDataCheckpointData::GetDatabase(this->checkpoint_data);
  type = ColumnDataCheckpointData::GetType(this->checkpoint_data);
  function = this->function;
  segment_size = CompressionInfo::GetBlockSize(&(this->super_CompressionState).info);
  ColumnSegment::CreateTransientSegment
            ((ColumnSegment *)local_38,db,function,type,row_start,segment_size,
             (this->super_CompressionState).info.block_manager);
  if (type->physical_type_ == VARCHAR) {
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                         *)local_38);
    local_30._M_head_impl =
         (pCVar3->segment_state).
         super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
         .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
    pCVar4 = optional_ptr<duckdb::CompressedSegmentState,_true>::operator->
                       ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_30);
    pCVar5 = ColumnDataCheckpointData::GetCheckpointState(this->checkpoint_data);
    this_00 = pCVar5->partial_block_manager;
    pBVar6 = PartialBlockManager::GetBlockManager(this_00);
    pCVar4[10]._vptr_CompressedSegmentState = (_func_int **)pBVar6;
    make_uniq<duckdb::WriteOverflowStringsToDisk,duckdb::PartialBlockManager&>
              ((duckdb *)&local_30,this_00);
    _Var2._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (CompressedSegmentState *)0x0;
    pp_Var1 = pCVar4[9]._vptr_CompressedSegmentState;
    pCVar4[9]._vptr_CompressedSegmentState = (_func_int **)_Var2._M_head_impl;
    if (pp_Var1 != (_func_int **)0x0) {
      (**(code **)(*pp_Var1 + 8))();
      if (local_30._M_head_impl != (CompressedSegmentState *)0x0) {
        (*(local_30._M_head_impl)->_vptr_CompressedSegmentState[1])();
      }
    }
  }
  __p = local_38;
  local_38 = (undefined1  [8])0x0;
  ::std::__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::reset
            ((__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
             &this->current_segment,(pointer)__p);
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  ColumnSegment::InitializeAppend(pCVar3,&this->append_state);
  ::std::unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::~unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
             local_38);
  return;
}

Assistant:

void UncompressedCompressState::CreateEmptySegment(idx_t row_start) {
	auto &db = checkpoint_data.GetDatabase();
	auto &type = checkpoint_data.GetType();

	auto compressed_segment = ColumnSegment::CreateTransientSegment(db, function, type, row_start, info.GetBlockSize(),
	                                                                info.GetBlockManager());
	if (type.InternalType() == PhysicalType::VARCHAR) {
		auto &state = compressed_segment->GetSegmentState()->Cast<UncompressedStringSegmentState>();
		auto &partial_block_manager = checkpoint_data.GetCheckpointState().GetPartialBlockManager();
		state.block_manager = partial_block_manager.GetBlockManager();
		state.overflow_writer = make_uniq<WriteOverflowStringsToDisk>(partial_block_manager);
	}
	current_segment = std::move(compressed_segment);
	current_segment->InitializeAppend(append_state);
}